

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O2

bool BRD2File::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"BRDOUT:",&local_51);
  bVar1 = find_str_in_buf(&local_30,buf);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NETS:",&local_52);
    bVar1 = find_str_in_buf(&local_50,buf);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool BRD2File::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("BRDOUT:", buf) && find_str_in_buf("NETS:", buf);
}